

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

String testing::internal::FormatForComparisonFailureMessage<double,int>(double *value,int *param_2)

{
  size_t extraout_RDX;
  String SVar1;
  string local_30;
  
  PrintToString<double>(&local_30,(double *)param_2);
  String::String((String *)value,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  SVar1.length_ = extraout_RDX;
  SVar1.c_str_ = (char *)value;
  return SVar1;
}

Assistant:

String FormatForComparisonFailureMessage(const T1& value,
                                         const T2& /* other_operand */) {
  // C++Builder compiles this incorrectly if the namespace isn't explicitly
  // given.
  return ::testing::PrintToString(value);
}